

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O2

encoding_t detect_encoding(str *s)

{
  ulong uVar1;
  
  uVar1 = 0;
  while( true ) {
    if (s->_M_string_length <= uVar1) {
      return ENC_ASCII;
    }
    if ((s->_M_dataplus)._M_p[uVar1] < '\0') break;
    uVar1 = uVar1 + 1;
  }
  return ENC_SINGLE_BYTE;
}

Assistant:

encoding_t detect_encoding(const str& s) {
    bool anyhigh = false;
    for (size_t i = 0; i < s.size();) {
        if ((s[i] & 0x80) == 0) {
            i += 1;
            continue;
        }
        anyhigh = true;
        if ((s[i] & 0xE0) == 0xC0 && (s[i + 1] & 0xC0) == 0x80) {
            if (read_UTF8_ch(&s[i]) < 0x80)
                return ENC_SINGLE_BYTE;
            i += 2;
        } else if ((s[i] & 0xF0) == 0xE0 && (s[i + 1] & 0xC0) == 0x80 && (s[i + 2] & 0xC0) == 0x80) {
            if (read_UTF8_ch(&s[i]) < 0x800)
                return ENC_SINGLE_BYTE;
            i += 3;
        } else if ((s[i] & 0xF8) == 0xF0 && (s[i + 1] & 0xC0) == 0x80 && (s[i + 2] & 0xC0) == 0x80 && (s[i + 3] & 0xC0) == 0x80) {
            int c = read_UTF8_ch(&s[i]);
            if (c < 0x10000 || c > 0x10FFFF)
                return ENC_SINGLE_BYTE;
            i += 4;
        } else {
            return ENC_SINGLE_BYTE;
        }
    }
    return anyhigh ? ENC_UTF8 : ENC_ASCII;
}